

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

int oSplitByDep(Abc_Ntk_t *pNtk,Vec_Int_t **oDep,Vec_Int_t **oMatch,int *oGroup,int *oLastItem,
               int *iGroup)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *p_00;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  bool bVar16;
  
  iVar11 = *oLastItem;
  if (iVar11 < 1) {
    iVar4 = 0;
  }
  else {
    lVar10 = 0;
    iVar12 = 0;
    do {
      pVVar14 = oMatch[lVar10];
      iVar1 = pVVar14->nSize;
      iVar4 = iVar12;
      if (iVar1 != 1) {
        p = (Vec_Int_t *)malloc(0x10);
        iVar11 = iVar1;
        if (iVar1 - 1U < 0xf) {
          iVar11 = 0x10;
        }
        p->nSize = 0;
        p->nCap = iVar11;
        if (iVar11 == 0) {
          piVar5 = (int *)0x0;
        }
        else {
          piVar5 = (int *)malloc((long)iVar11 * 4);
        }
        p->pArray = piVar5;
        p_00 = (Vec_Int_t *)malloc(0x10);
        p_00->nSize = 0;
        p_00->nCap = iVar11;
        if (iVar11 == 0) {
          piVar5 = (int *)0x0;
        }
        else {
          piVar5 = (int *)malloc((long)iVar11 << 2);
        }
        p_00->pArray = piVar5;
        if (0 < iVar1) {
          lVar15 = 0;
          do {
            lVar6 = (long)oDep[pVVar14->pArray[lVar15]]->nSize;
            if (lVar6 < 1) {
              iVar11 = 0;
            }
            else {
              lVar9 = 0;
              iVar11 = 0;
              do {
                iVar11 = iVar11 + iGroup[oDep[pVVar14->pArray[lVar15]]->pArray[lVar9]];
                lVar9 = lVar9 + 1;
              } while (lVar6 != lVar9);
            }
            Vec_IntPush(p,iVar11);
            if (0 < (long)p_00->nSize) {
              lVar6 = 0;
              do {
                if (p_00->pArray[lVar6] == iVar11) goto LAB_0029a624;
                lVar6 = lVar6 + 1;
              } while (p_00->nSize != lVar6);
            }
            Vec_IntPushOrder(p_00,iVar11);
LAB_0029a624:
            if (iVar11 < 0) {
              printf("WARNING! Integer overflow!");
            }
            lVar15 = lVar15 + 1;
            pVVar14 = oMatch[lVar10];
          } while (lVar15 < pVVar14->nSize);
          lVar15 = (long)p_00->nSize;
          if (1 < lVar15) {
            iVar4 = iVar12 + p_00->nSize + -1;
            do {
              if (0 < pVVar14->nSize) {
                uVar13 = 0;
                do {
                  iVar11 = (int)uVar13;
                  if (iVar11 < 0) {
LAB_0029a850:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  uVar2 = p->nSize;
                  if ((int)uVar2 <= iVar11) goto LAB_0029a850;
                  piVar5 = p->pArray;
                  if (piVar5[uVar13] == p_00->pArray[lVar15 + -1]) {
                    Vec_IntPush(oMatch[(long)iVar12 + (long)*oLastItem],pVVar14->pArray[uVar13]);
                    pVVar14 = oMatch[lVar10];
                    if (iVar11 < pVVar14->nSize) {
                      piVar3 = pVVar14->pArray;
                      oGroup[piVar3[uVar13]] = *oLastItem + iVar12;
                      uVar8 = pVVar14->nSize;
                      if (iVar11 < (int)uVar8) {
                        uVar7 = 1;
LAB_0029a731:
                        if (piVar3[uVar7 - 1] != piVar3[uVar13]) goto code_r0x0029a737;
                        if ((int)uVar7 < (int)uVar8) {
                          do {
                            piVar3[uVar7 - 1] = piVar3[uVar7];
                            uVar7 = uVar7 + 1;
                            uVar8 = pVVar14->nSize;
                          } while ((int)uVar7 < (int)uVar8);
                        }
                        pVVar14->nSize = uVar8 - 1;
LAB_0029a765:
                        uVar7 = 1;
                        while (piVar5[uVar7 - 1] != piVar5[uVar13]) {
                          bVar16 = uVar7 == uVar2;
                          uVar7 = uVar7 + 1;
                          if (bVar16) goto LAB_0029a7ab;
                        }
                        if ((int)uVar7 < (int)uVar2) {
                          do {
                            piVar5[uVar7 - 1] = piVar5[uVar7];
                            uVar7 = uVar7 + 1;
                          } while (uVar2 != (uint)uVar7);
                        }
                        p->nSize = uVar2 - 1;
LAB_0029a7ab:
                        iVar11 = iVar11 + -1;
                        goto LAB_0029a7b2;
                      }
                    }
                    goto LAB_0029a850;
                  }
LAB_0029a7b2:
                  uVar13 = (ulong)(iVar11 + 1U);
                } while ((int)(iVar11 + 1U) < pVVar14->nSize);
              }
              iVar12 = iVar12 + 1;
              lVar15 = lVar15 + -1;
              p_00->nSize = (int)lVar15;
            } while (iVar12 != iVar4);
          }
        }
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
        }
        free(p);
        if (p_00->pArray != (int *)0x0) {
          free(p_00->pArray);
        }
        free(p_00);
        iVar11 = *oLastItem;
      }
      lVar10 = lVar10 + 1;
      iVar12 = iVar4;
    } while (lVar10 < iVar11);
  }
  *oLastItem = iVar11 + iVar4;
  return iVar4;
code_r0x0029a737:
  bVar16 = uVar7 == uVar8;
  uVar7 = uVar7 + 1;
  if (bVar16) goto LAB_0029a765;
  goto LAB_0029a731;
}

Assistant:

int oSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, Vec_Int_t** oMatch, int* oGroup, int* oLastItem, int* iGroup)
{
    int i, j, k;
    int numOfItemsAdded;
    Vec_Int_t * array, * sortedArray;    

    numOfItemsAdded = 0;

    for(i = 0; i < *oLastItem; i++)
    {
        if(Vec_IntSize(oMatch[i]) == 1)
            continue;

        array = Vec_IntAlloc( Vec_IntSize(oMatch[i]) );
        sortedArray = Vec_IntAlloc( Vec_IntSize(oMatch[i]) );

        for(j = 0; j < Vec_IntSize(oMatch[i]); j++)
        {
            int factor, encode;

            encode = 0;
            factor = 1;    
            
            for(k = 0; k < Vec_IntSize(oDep[Vec_IntEntry(oMatch[i], j)]); k++)                                        
                encode += iGroup[Vec_IntEntry(oDep[Vec_IntEntry(oMatch[i], j)], k)] * factor;                        
            
            Vec_IntPush(array, encode);
            Vec_IntPushUniqueOrder(sortedArray, encode);

            if( encode < 0)
                printf("WARNING! Integer overflow!");

            //printf("%d ", Vec_IntEntry(array, j));
        }                
        
        while( Vec_IntSize(sortedArray) > 1 )
        {            
            for(k = 0; k < Vec_IntSize(oMatch[i]); k++) 
            {
                if(Vec_IntEntry(array, k) == Vec_IntEntryLast(sortedArray))
                {
                    Vec_IntPush(oMatch[*oLastItem+numOfItemsAdded], Vec_IntEntry(oMatch[i], k));
                    oGroup[Vec_IntEntry(oMatch[i], k)] = *oLastItem+numOfItemsAdded;
                    Vec_IntRemove( oMatch[i], Vec_IntEntry(oMatch[i], k) );        
                    Vec_IntRemove( array, Vec_IntEntry(array, k) );            
                    k--;
                }    
            }            
            numOfItemsAdded++;
            Vec_IntPop(sortedArray);                        
        }

        Vec_IntFree( array );        
        Vec_IntFree( sortedArray );        
        //printf("\n");
    }    

    *oLastItem += numOfItemsAdded;

    /*printf("\n");
    for(j = 0; j < *oLastItem ; j++)
    {
        printf("oMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(oMatch[j]); i++)
            printf("%d ", Vec_IntEntry(oMatch[j], i));
        printf("\n");
    }*/

    return numOfItemsAdded;
}